

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorPoolManager.cpp
# Opt level: O2

void __thiscall Diligent::DescriptorPoolManager::~DescriptorPoolManager(DescriptorPoolManager *this)

{
  char (*in_R9) [9];
  string msg;
  size_type local_20;
  
  if ((this->m_AllocatedPoolCounter).super___atomic_base<int>._M_i != 0) {
    FormatString<char[68]>
              (&msg,(char (*) [68])
                    "Not all allocated descriptor pools are returned to the pool manager");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"~DescriptorPoolManager",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DescriptorPoolManager.cpp"
               ,0x66);
    std::__cxx11::string::~string((string *)&msg);
  }
  local_20 = std::
             deque<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
             ::size(&this->m_Pools);
  FormatString<std::__cxx11::string,char[19],unsigned_long,char[9]>
            (&msg,(Diligent *)&this->m_PoolName,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             " stats: allocated ",(char (*) [19])&local_20,(unsigned_long *)" pool(s)",in_R9);
  if (DebugMessageCallback != (undefined *)0x0) {
    (*(code *)DebugMessageCallback)(0,msg._M_dataplus._M_p,0,0,0);
  }
  std::__cxx11::string::~string((string *)&msg);
  std::
  deque<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
  ::~deque(&this->m_Pools);
  std::_Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>::~_Vector_base
            (&(this->m_PoolSizes).
              super__Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>);
  std::__cxx11::string::~string((string *)&this->m_PoolName);
  return;
}

Assistant:

DescriptorPoolManager::~DescriptorPoolManager()
{
    DEV_CHECK_ERR(m_AllocatedPoolCounter == 0, "Not all allocated descriptor pools are returned to the pool manager");
    LOG_INFO_MESSAGE(m_PoolName, " stats: allocated ", m_Pools.size(), " pool(s)");
}